

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrBodyJointLocationsFB *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *this;
  string time_prefix;
  string type_prefix;
  string skeletonchangedcount_prefix;
  string jointlocations_prefix;
  string jointcount_prefix;
  string confidence_prefix;
  string isactive_prefix;
  string next_prefix;
  string local_7c8;
  string local_7a8;
  ostringstream oss_isActive;
  ostringstream oss_jointLocations;
  uint auStack_5f8 [88];
  ostringstream oss_confidence;
  undefined8 local_490 [46];
  ostringstream oss_skeletonChangedCount;
  ostringstream oss_jointCount;
  
  PointerToHexString<XrBodyJointLocationsFB>((XrBodyJointLocationsFB *)time_prefix._M_dataplus._M_p)
  ;
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_isActive);
  std::__cxx11::string::~string((string *)&oss_isActive);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_isActive,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_isActive);
    std::__cxx11::string::~string((string *)&oss_isActive);
  }
  else {
    _oss_isActive = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_isActive);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_isActive);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_7a8,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_7a8,contents);
  std::__cxx11::string::~string((string *)&local_7a8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&isactive_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&isactive_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_isActive);
    poVar4 = std::operator<<((ostream *)&oss_isActive,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"XrBool32",&isactive_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_confidence)
    ;
    std::__cxx11::string::~string((string *)&oss_confidence);
    std::__cxx11::string::string((string *)&confidence_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&confidence_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_confidence);
    *(undefined8 *)((long)local_490 + *(long *)(_oss_confidence + -0x18)) = 0x20;
    std::ostream::operator<<((ostream *)&oss_confidence,value->confidence);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&confidence_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_jointCount)
    ;
    std::__cxx11::string::~string((string *)&oss_jointCount);
    std::__cxx11::string::string((string *)&jointcount_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&jointcount_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_jointCount);
    poVar4 = std::operator<<((ostream *)&oss_jointCount,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&jointcount_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_jointLocations);
    std::__cxx11::string::~string((string *)&oss_jointLocations);
    std::__cxx11::string::string((string *)&jointlocations_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&jointlocations_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_jointLocations);
    *(uint *)((long)auStack_5f8 + *(long *)(_oss_jointLocations + -0x18)) =
         *(uint *)((long)auStack_5f8 + *(long *)(_oss_jointLocations + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_jointLocations);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[23],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [23])"XrBodyJointLocationFB*",&jointlocations_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_skeletonChangedCount);
    std::__cxx11::string::~string((string *)&oss_skeletonChangedCount);
    std::__cxx11::string::string((string *)&skeletonchangedcount_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&skeletonchangedcount_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_skeletonChangedCount);
    poVar4 = std::operator<<((ostream *)&oss_skeletonChangedCount,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&skeletonchangedcount_prefix,&time_prefix);
    std::__cxx11::string::~string((string *)&time_prefix);
    std::__cxx11::string::string((string *)&time_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&time_prefix);
    std::__cxx11::to_string(&local_7c8,value->time);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [7])"XrTime",&time_prefix,&local_7c8);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::__cxx11::string::~string((string *)&time_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_skeletonChangedCount);
    std::__cxx11::string::~string((string *)&skeletonchangedcount_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_jointLocations);
    std::__cxx11::string::~string((string *)&jointlocations_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_jointCount);
    std::__cxx11::string::~string((string *)&jointcount_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_confidence);
    std::__cxx11::string::~string((string *)&confidence_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_isActive);
    std::__cxx11::string::~string((string *)&isactive_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrBodyJointLocationsFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string isactive_prefix = prefix;
        isactive_prefix += "isActive";
        std::ostringstream oss_isActive;
        oss_isActive << "0x" << std::hex << (value->isActive);
        contents.emplace_back("XrBool32", isactive_prefix, oss_isActive.str());
        std::string confidence_prefix = prefix;
        confidence_prefix += "confidence";
        std::ostringstream oss_confidence;
        oss_confidence << std::setprecision(32) << (value->confidence);
        contents.emplace_back("float", confidence_prefix, oss_confidence.str());
        std::string jointcount_prefix = prefix;
        jointcount_prefix += "jointCount";
        std::ostringstream oss_jointCount;
        oss_jointCount << "0x" << std::hex << (value->jointCount);
        contents.emplace_back("uint32_t", jointcount_prefix, oss_jointCount.str());
        std::string jointlocations_prefix = prefix;
        jointlocations_prefix += "jointLocations";
        std::ostringstream oss_jointLocations;
        oss_jointLocations << std::hex << reinterpret_cast<const void*>(value->jointLocations);
        contents.emplace_back("XrBodyJointLocationFB*", jointlocations_prefix, oss_jointLocations.str());
        std::string skeletonchangedcount_prefix = prefix;
        skeletonchangedcount_prefix += "skeletonChangedCount";
        std::ostringstream oss_skeletonChangedCount;
        oss_skeletonChangedCount << "0x" << std::hex << (value->skeletonChangedCount);
        contents.emplace_back("uint32_t", skeletonchangedcount_prefix, oss_skeletonChangedCount.str());
        std::string time_prefix = prefix;
        time_prefix += "time";
        contents.emplace_back("XrTime", time_prefix, std::to_string(value->time));
        return true;
    } catch(...) {
    }
    return false;
}